

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::texstorage3d_invalid_levels
               (NegativeTestContext *ctx)

{
  deUint32 adVar1 [2];
  bool bVar2;
  RenderContext *pRVar3;
  ContextInfo *pCVar4;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  deUint32 local_28;
  ContextType local_24;
  byte local_1d;
  int local_1c;
  GLuint GStack_18;
  bool supportsES32;
  deUint32 log2MaxSize;
  deUint32 textures [2];
  NegativeTestContext *ctx_local;
  
  _GStack_18 = 0x123400001234;
  textures = (deUint32  [2])ctx;
  local_1c = ::deLog2Floor32(8);
  local_1c = local_1c + 2;
  pRVar3 = NegativeTestContext::getRenderContext((NegativeTestContext *)textures);
  local_24.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  local_28 = (deUint32)glu::ApiType::es(3,2);
  local_1d = glu::contextSupports(local_24,(ApiType)local_28);
  glu::CallLogWrapper::glGenTextures((CallLogWrapper *)textures,2,&stack0xffffffffffffffe8);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)textures,0x806f,GStack_18);
  adVar1 = textures;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"GL_INVALID_VALUE is generated if levels is less than 1.",&local_49
            );
  NegativeTestContext::beginSection((NegativeTestContext *)adVar1,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  glu::CallLogWrapper::glTexStorage3D((CallLogWrapper *)textures,0x806f,0,0x8058,4,4,4);
  NegativeTestContext::expectError((NegativeTestContext *)textures,0x501);
  glu::CallLogWrapper::glTexStorage3D((CallLogWrapper *)textures,0x806f,0,0x8058,0,0,0);
  NegativeTestContext::expectError((NegativeTestContext *)textures,0x501);
  if ((local_1d & 1) == 0) {
    pCVar4 = NegativeTestContext::getContextInfo((NegativeTestContext *)textures);
    bVar2 = glu::ContextInfo::isExtensionSupported(pCVar4,"GL_OES_texture_cube_map_array");
    if (bVar2) goto LAB_022c83c2;
  }
  else {
LAB_022c83c2:
    glu::CallLogWrapper::glBindTexture((CallLogWrapper *)textures,0x9009,log2MaxSize);
    glu::CallLogWrapper::glTexStorage3D((CallLogWrapper *)textures,0x9009,0,0x8058,4,4,6);
    NegativeTestContext::expectError((NegativeTestContext *)textures,0x501);
    glu::CallLogWrapper::glTexStorage3D((CallLogWrapper *)textures,0x9009,0,0x8058,0,0,6);
    NegativeTestContext::expectError((NegativeTestContext *)textures,0x501);
  }
  NegativeTestContext::endSection((NegativeTestContext *)textures);
  adVar1 = textures;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,
             "GL_INVALID_OPERATION is generated if levels is greater than floor(log_2(max(width, height, depth))) + 1"
             ,&local_81);
  NegativeTestContext::beginSection((NegativeTestContext *)adVar1,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  glu::CallLogWrapper::glTexStorage3D((CallLogWrapper *)textures,0x806f,local_1c,0x8058,8,2,2);
  NegativeTestContext::expectError((NegativeTestContext *)textures,0x502);
  glu::CallLogWrapper::glTexStorage3D((CallLogWrapper *)textures,0x806f,local_1c,0x8058,2,8,2);
  NegativeTestContext::expectError((NegativeTestContext *)textures,0x502);
  glu::CallLogWrapper::glTexStorage3D((CallLogWrapper *)textures,0x806f,local_1c,0x8058,2,2,8);
  NegativeTestContext::expectError((NegativeTestContext *)textures,0x502);
  glu::CallLogWrapper::glTexStorage3D((CallLogWrapper *)textures,0x806f,local_1c,0x8058,8,8,8);
  NegativeTestContext::expectError((NegativeTestContext *)textures,0x502);
  if ((local_1d & 1) == 0) {
    pCVar4 = NegativeTestContext::getContextInfo((NegativeTestContext *)textures);
    bVar2 = glu::ContextInfo::isExtensionSupported(pCVar4,"GL_OES_texture_cube_map_array");
    if (!bVar2) goto LAB_022c8660;
  }
  glu::CallLogWrapper::glTexStorage3D((CallLogWrapper *)textures,0x9009,local_1c,0x8058,2,2,6);
  NegativeTestContext::expectError((NegativeTestContext *)textures,0x502);
  glu::CallLogWrapper::glTexStorage3D((CallLogWrapper *)textures,0x9009,local_1c,0x8058,8,8,6);
  NegativeTestContext::expectError((NegativeTestContext *)textures,0x502);
LAB_022c8660:
  NegativeTestContext::endSection((NegativeTestContext *)textures);
  glu::CallLogWrapper::glDeleteTextures((CallLogWrapper *)textures,2,&stack0xffffffffffffffe8);
  return;
}

Assistant:

void texstorage3d_invalid_levels (NegativeTestContext& ctx)
{
	deUint32	textures[]		= {0x1234, 0x1234};
	deUint32	log2MaxSize		= deLog2Floor32(8) + 1 + 1;
	const bool	supportsES32	= contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	ctx.glGenTextures(2, textures);
	ctx.glBindTexture(GL_TEXTURE_3D, textures[0]);

	ctx.beginSection("GL_INVALID_VALUE is generated if levels is less than 1.");
	ctx.glTexStorage3D(GL_TEXTURE_3D, 0, GL_RGBA8, 4, 4, 4);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexStorage3D(GL_TEXTURE_3D, 0, GL_RGBA8, 0, 0, 0);
	ctx.expectError(GL_INVALID_VALUE);

	if (supportsES32 || ctx.getContextInfo().isExtensionSupported("GL_OES_texture_cube_map_array"))
	{
		ctx.glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, textures[1]);
		ctx.glTexStorage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, GL_RGBA8, 4, 4, 6);
		ctx.expectError(GL_INVALID_VALUE);
		ctx.glTexStorage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, GL_RGBA8, 0, 0, 6);
		ctx.expectError(GL_INVALID_VALUE);
	}
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if levels is greater than floor(log_2(max(width, height, depth))) + 1");
	ctx.glTexStorage3D	(GL_TEXTURE_3D, log2MaxSize, GL_RGBA8, 8, 2, 2);
	ctx.expectError		(GL_INVALID_OPERATION);
	ctx.glTexStorage3D	(GL_TEXTURE_3D, log2MaxSize, GL_RGBA8, 2, 8, 2);
	ctx.expectError		(GL_INVALID_OPERATION);
	ctx.glTexStorage3D	(GL_TEXTURE_3D, log2MaxSize, GL_RGBA8, 2, 2, 8);
	ctx.expectError		(GL_INVALID_OPERATION);
	ctx.glTexStorage3D	(GL_TEXTURE_3D, log2MaxSize, GL_RGBA8, 8, 8, 8);
	ctx.expectError		(GL_INVALID_OPERATION);

	if (supportsES32 || ctx.getContextInfo().isExtensionSupported("GL_OES_texture_cube_map_array"))
	{
		ctx.glTexStorage3D	(GL_TEXTURE_CUBE_MAP_ARRAY, log2MaxSize, GL_RGBA8, 2, 2, 6);
		ctx.expectError		(GL_INVALID_OPERATION);
		ctx.glTexStorage3D	(GL_TEXTURE_CUBE_MAP_ARRAY, log2MaxSize, GL_RGBA8, 8, 8, 6);
		ctx.expectError		(GL_INVALID_OPERATION);
	}
	ctx.endSection();

	ctx.glDeleteTextures(2, textures);
}